

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O1

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>::
ContIntLoadResidual_CqL
          (ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_> *this
          ,uint off_L,ChVectorDynamic<> *R,ChVectorDynamic<> *L,double c)

{
  double dVar1;
  
  if ((long)(ulong)off_L <
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    dVar1 = c * (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                [off_L];
    ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::MultiplyTandAdd
              (&(this->Nx).
                super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                .tuple_a,R,dVar1);
    ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::MultiplyTandAdd
              (&(this->Nx).
                super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                .tuple_b,R,dVar1);
    if ((long)(ulong)(off_L + 1) <
        (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      dVar1 = c * (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data[off_L + 1];
      ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::MultiplyTandAdd
                (&(this->Tu).
                  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                  .tuple_a,R,dVar1);
      ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::MultiplyTandAdd
                (&(this->Tu).
                  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                  .tuple_b,R,dVar1);
      if ((long)(ulong)(off_L + 2) <
          (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
        dVar1 = c * (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data[off_L + 2];
        ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::MultiplyTandAdd
                  (&(this->Tv).
                    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                    .tuple_a,R,dVar1);
        ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::MultiplyTandAdd
                  (&(this->Tv).
                    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                    .tuple_b,R,dVar1);
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

virtual void ContIntLoadResidual_CqL(const unsigned int off_L,    
                                         ChVectorDynamic<>& R,        
                                         const ChVectorDynamic<>& L,  
                                         const double c               
                                         ) override {
        this->Nx.MultiplyTandAdd(R, L(off_L) * c);
        this->Tu.MultiplyTandAdd(R, L(off_L + 1) * c);
        this->Tv.MultiplyTandAdd(R, L(off_L + 2) * c);
    }